

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfonticonengine.cpp
# Opt level: O3

QString * __thiscall QFontIconEngine::key(QString *__return_storage_ptr__,QFontIconEngine *this)

{
  longlong __old_val;
  long in_FS_OFFSET;
  QString local_a8;
  QStringBuilder<QString,_QString> local_90;
  QStringBuilder<QStringBuilder<QString,_QString>,_char16_t> local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QFont::key(&local_a8,&this->m_iconFont);
  local_60.a.b.d.size = local_a8.d.size;
  local_60.a.b.d.ptr = local_a8.d.ptr;
  local_60.a.b.d.d = local_a8.d.d;
  local_a8.d.size = 0;
  local_90.a.d.d = (Data *)0x0;
  local_60.a.a.d.d = (Data *)0x0;
  local_90.a.d.ptr = (char16_t *)0x0;
  local_90.a.d.size = 0;
  local_60.a.a.d.ptr = L"QFontIconEngine(";
  local_60.a.a.d.size = 0x10;
  local_90.b.d.d = (Data *)0x0;
  local_90.b.d.ptr = (char16_t *)0x0;
  local_a8.d.d = (Data *)0x0;
  local_a8.d.ptr = (char16_t *)0x0;
  local_90.b.d.size = 0;
  local_60.b = L')';
  QStringBuilder<QStringBuilder<QString,_QString>,_char16_t>::convertTo<QString>
            (__return_storage_ptr__,&local_60);
  QStringBuilder<QString,_QString>::~QStringBuilder(&local_60.a);
  QStringBuilder<QString,_QString>::~QStringBuilder(&local_90);
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QFontIconEngine::key() const
{
    return u"QFontIconEngine("_s + m_iconFont.key() + u')';
}